

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar __thiscall
Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::mean
          (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this)

{
  Scalar SVar1;
  scalar_sum_op<double,_double> local_9;
  
  SVar1 = DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          redux<Eigen::internal::scalar_sum_op<double,double>>
                    ((DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,&local_9);
  return SVar1 / (double)(*(long *)(this + 0x10) * *(long *)(this + 8));
}

Assistant:

EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::mean() const
{
#ifdef __INTEL_COMPILER
  #pragma warning push
  #pragma warning ( disable : 2259 )
#endif
  return Scalar(derived().redux(Eigen::internal::scalar_sum_op<Scalar,Scalar>())) / Scalar(this->size());
#ifdef __INTEL_COMPILER
  #pragma warning pop
#endif
}